

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Vector<float,_4>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::
ApplyReflect<4,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>::apply
          (ApplyReflect<4,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>
           *this,ExpandContext *ctx,ExprP<tcu::Vector<float,_4>_> *i,
          ExprP<tcu::Vector<float,_4>_> *n)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_4>_> EVar1;
  ExprP<float> dotNI;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> SStack_b8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> local_a8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_98;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_88;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_78;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_68;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_> local_58;
  string local_48;
  float local_28;
  float local_24;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"dotNI",(allocator<char> *)&local_98);
  dot<4>((Functions *)&SStack_b8,n,i);
  bindExpression<float>((BuiltinPrecisionTests *)&local_a8,&local_48,ctx,(ExprP<float> *)&SStack_b8)
  ;
  VariableP::operator_cast_to_ExprP((VariableP *)&local_88);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::release(&local_a8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&SStack_b8);
  std::__cxx11::string::~string((string *)&local_48);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&SStack_b8,n,(ExprP<float> *)&local_88);
  local_24 = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_98,&local_24);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_a8,(ExprP<tcu::Vector<float,_4>_> *)&SStack_b8,
             (ExprP<float> *)&local_98);
  local_28 = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_78,&local_28);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_68,(ExprP<float> *)&local_88,(ExprP<float> *)&local_78)
  ;
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_58,n,(ExprP<float> *)&local_68);
  alternatives<tcu::Vector<float,4>>
            ((BuiltinPrecisionTests *)&local_48,(ExprP<tcu::Vector<float,_4>_> *)&local_a8,
             (ExprP<tcu::Vector<float,_4>_> *)&local_58);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)this,i,(ExprP<tcu::Vector<float,_4>_> *)&local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_> *)
             &local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::release
            (&local_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_68);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_78);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_> *)
             &local_a8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_98);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_> *)
             &SStack_b8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_88);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_4>_> *)this;
  return (ExprP<tcu::Vector<float,_4>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
         super_ExprPBase<tcu::Vector<float,_4>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>;
}

Assistant:

static ExprP<Ret> apply	(ExpandContext&		ctx,
							 const ExprP<Arg0>&	i,
							 const ExprP<Arg1>&	n)
	{
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));

		return i - alternatives((n * dotNI) * constant(2.0f),
								n * (dotNI * constant(2.0f)));
	}